

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

void shuffle(int *arr,wchar_t n)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = 0;
  if (L'\0' < n) {
    uVar4 = (ulong)(uint)n;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar2 = Rand_div(n);
    iVar3 = uVar2 + (int)uVar5;
    iVar1 = arr[iVar3];
    arr[iVar3] = arr[uVar5];
    arr[uVar5] = iVar1;
    n = n + L'\xffffffff';
  }
  return;
}

Assistant:

void shuffle(int *arr, int n)
{
	int i, j, k;
	for (i = 0; i < n; i++) {
		j = randint0(n - i) + i;
		k = arr[j];
		arr[j] = arr[i];
		arr[i] = k;
	}
}